

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

vector2 * vector2_get_reference_vector2(int id)

{
  if (id - 1U < 5) {
    return (vector2 *)(&PTR__vector2_unit_x_00118d50)[id - 1U];
  }
  return &_vector2_zero;
}

Assistant:

HYPAPI const struct vector2 *vector2_get_reference_vector2(int id)
{
	switch (id) {
	case HYP_REF_VECTOR2_ZERO:
		return &_vector2_zero;
	case HYP_REF_VECTOR2_ONE:
		return &_vector2_one;
	case HYP_REF_VECTOR2_UNIT_X:
		return &_vector2_unit_x;
	case HYP_REF_VECTOR2_UNIT_Y:
		return &_vector2_unit_y;
	case HYP_REF_VECTOR2_UNIT_X_NEGATIVE:
		return &_vector2_unit_x_negative;
	case HYP_REF_VECTOR2_UNIT_Y_NEGATIVE:
		return &_vector2_unit_y_negative;
	default:
		/* undefined case */
		return &_vector2_zero;
	}
}